

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O1

void __thiscall glcts::TextureCubeMapArraySubImage3D::deinit(TextureCubeMapArraySubImage3D *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x78))(0x8ca8,0);
  if (this->m_read_fbo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_read_fbo_id);
    this->m_read_fbo_id = 0;
  }
  deletePixelUnpackBuffer(this);
  deleteCubeMapArrayTexture(this);
  delete2DTexture(this);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES configuration */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);

	/* Delete GLES objects */
	if (m_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_read_fbo_id);
		m_read_fbo_id = 0;
	}

	/* Delete pixel unpack buffer */
	deletePixelUnpackBuffer();

	/* Delete cube map array texture */
	deleteCubeMapArrayTexture();

	/* Delete 2D texture */
	delete2DTexture();

	/* Deinitialize base class */
	TestCaseBase::deinit();
}